

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall Assimp::FBXExporter::WriteGlobalSettings(FBXExporter *this)

{
  string sStack_188;
  allocator<char> local_164;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  string local_160;
  Node p;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_d0;
  string local_c0;
  string local_a0;
  Node gs;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"GlobalSettings",(allocator<char> *)&sStack_188);
  FBX::Node::Node(&gs,&p.name);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"Version",(allocator<char> *)&sStack_188);
  FBX::Node::AddChild<int>(&gs,&p.name,1000);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"Properties70",(allocator<char> *)&local_160);
  FBX::Node::Node(&p,&sStack_188);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"UpAxis",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"UpAxisSign",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"FrontAxis",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,2);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"FrontAxisSign",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"CoordAxis",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"CoordAxisSign",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"OriginalUpAxis",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"OriginalUpAxisSign",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"UnitScaleFactor",(allocator<char> *)&local_160);
  FBX::Node::AddP70double(&p,&sStack_188,1.0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"OriginalUnitScaleFactor",(allocator<char> *)&local_160);
  FBX::Node::AddP70double(&p,&sStack_188,1.0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"AmbientColor",(allocator<char> *)&local_160);
  FBX::Node::AddP70color(&p,&sStack_188,0.0,0.0,0.0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"DefaultCamera",(allocator<char> *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Producer Perspective",(allocator<char> *)&local_c0);
  FBX::Node::AddP70string(&p,&sStack_188,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"TimeMode",(allocator<char> *)&local_160);
  FBX::Node::AddP70enum(&p,&sStack_188,0xb);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"TimeProtocol",(allocator<char> *)&local_160);
  FBX::Node::AddP70enum(&p,&sStack_188,2);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"SnapOnFrameMode",(allocator<char> *)&local_160);
  FBX::Node::AddP70enum(&p,&sStack_188,0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"TimeSpanStart",(allocator<char> *)&local_160);
  FBX::Node::AddP70time(&p,&sStack_188,0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"TimeSpanStop",(allocator<char> *)&local_160);
  FBX::Node::AddP70time(&p,&sStack_188,0xac0e8d7b0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"CustomFrameRate",(allocator<char> *)&local_160);
  FBX::Node::AddP70double(&p,&sStack_188,-1.0);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_188,"TimeMarker",&local_161);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Compound",&local_162);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_163);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_164);
  FBX::Node::AddP70<>(&p,&sStack_188,&local_160,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_188,"CurrentTimeMarker",(allocator<char> *)&local_160);
  FBX::Node::AddP70int(&p,&sStack_188,-1);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back(&gs.children,&p);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d0,
             &(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  FBX::Node::Dump(&gs,(shared_ptr<Assimp::IOStream> *)&local_d0,this->binary,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  FBX::Node::~Node(&p);
  FBX::Node::~Node(&gs);
  return;
}

Assistant:

void FBXExporter::WriteGlobalSettings ()
{
    if (!binary) {
        // no title, follows directly from the header extension
    }
    FBX::Node gs("GlobalSettings");
    gs.AddChild("Version", int32_t(1000));

    FBX::Node p("Properties70");
    p.AddP70int("UpAxis", 1);
    p.AddP70int("UpAxisSign", 1);
    p.AddP70int("FrontAxis", 2);
    p.AddP70int("FrontAxisSign", 1);
    p.AddP70int("CoordAxis", 0);
    p.AddP70int("CoordAxisSign", 1);
    p.AddP70int("OriginalUpAxis", 1);
    p.AddP70int("OriginalUpAxisSign", 1);
    p.AddP70double("UnitScaleFactor", 1.0);
    p.AddP70double("OriginalUnitScaleFactor", 1.0);
    p.AddP70color("AmbientColor", 0.0, 0.0, 0.0);
    p.AddP70string("DefaultCamera", "Producer Perspective");
    p.AddP70enum("TimeMode", 11);
    p.AddP70enum("TimeProtocol", 2);
    p.AddP70enum("SnapOnFrameMode", 0);
    p.AddP70time("TimeSpanStart", 0); // TODO: animation support
    p.AddP70time("TimeSpanStop", FBX::SECOND); // TODO: animation support
    p.AddP70double("CustomFrameRate", -1.0);
    p.AddP70("TimeMarker", "Compound", "", ""); // not sure what this is
    p.AddP70int("CurrentTimeMarker", -1);
    gs.AddChild(p);

    gs.Dump(outfile, binary, 0);
}